

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow *window)

{
  ImVec2 IVar1;
  uint uVar2;
  ImGuiWindow *this;
  ImGuiContext *pIVar3;
  ImGuiContext *g;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImVec2 ref_pos;
  ImRect r_outer;
  ImVec2 local_40;
  ImRect local_38;
  ImRect local_28;
  
  pIVar3 = GImGui;
  IVar1 = (GImGui->Style).DisplaySafeAreaPadding;
  fVar4 = IVar1.x;
  fVar7 = IVar1.y;
  IVar1 = (GImGui->IO).DisplaySize;
  fVar6 = IVar1.x;
  fVar5 = IVar1.y;
  local_38.Max.x = (float)((uint)-fVar4 & -(uint)(fVar4 + fVar4 < fVar6));
  local_38.Max.y = (float)((uint)-fVar7 & -(uint)(fVar7 + fVar7 < fVar5));
  local_38.Min.x = 0.0 - local_38.Max.x;
  local_38.Min.y = 0.0 - local_38.Max.y;
  local_38.Max.x = local_38.Max.x + fVar6;
  local_38.Max.y = local_38.Max.y + fVar5;
  uVar2 = window->Flags;
  if ((uVar2 >> 0x1c & 1) == 0) {
    if ((uVar2 >> 0x1a & 1) == 0) {
      if ((uVar2 >> 0x19 & 1) == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                      ,0x1e1e,"ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow *)");
      }
      fVar4 = (GImGui->Style).MouseCursorScale;
      local_40 = NavCalcPreferredRefPos();
      fVar7 = local_40.x;
      fVar6 = local_40.y;
      if (((pIVar3->NavDisableHighlight == false) && (pIVar3->NavDisableMouseHover == true)) &&
         (((pIVar3->IO).ConfigFlags & 4) == 0)) {
        local_28.Max.x = 16.0;
        local_28.Max.y = 8.0;
      }
      else {
        local_28.Max.x = fVar4 * 24.0;
        local_28.Max.y = local_28.Max.x;
      }
      local_28.Max.x = local_28.Max.x + fVar7;
      local_28.Max.y = local_28.Max.y + fVar6;
      local_28.Min.x = fVar7 + -16.0;
      local_28.Min.y = fVar6 + -8.0;
      IVar1 = FindBestWindowPosForPopupEx
                        (&local_40,&window->Size,&window->AutoPosLastDirection,&local_38,&local_28,
                         ImGuiPopupPositionPolicy_Default);
      fVar4 = IVar1.x;
      fVar5 = IVar1.y;
      if (window->AutoPosLastDirection == -1) {
        fVar4 = fVar7 + 2.0;
        fVar5 = fVar6 + 2.0;
      }
      goto LAB_00145909;
    }
    local_28.Max.x = (window->Pos).x;
    fVar4 = (window->Pos).y;
    local_28.Min.x = local_28.Max.x + -1.0;
    local_28.Max.x = local_28.Max.x + 1.0;
    local_28.Max.y = fVar4 + 1.0;
    local_28.Min.y = fVar4 + -1.0;
  }
  else {
    if (GImGui->CurrentWindow != window) {
      __assert_fail("g.CurrentWindow == window",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                    ,0x1e00,"ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow *)");
    }
    this = (GImGui->CurrentWindowStack).Data[(long)(GImGui->CurrentWindowStack).Size + -2];
    if ((this->DC).MenuBarAppending == true) {
      fVar4 = (this->Pos).y;
      fVar6 = 0.0;
      fVar7 = 0.0;
      if ((this->Flags & 1) == 0) {
        fVar7 = GImGui->FontBaseSize * this->FontWindowScale;
        if (this->ParentWindow != (ImGuiWindow *)0x0) {
          fVar7 = fVar7 * this->ParentWindow->FontWindowScale;
        }
        fVar5 = (GImGui->Style).FramePadding.y;
        fVar6 = fVar5 + fVar5 + fVar7;
        fVar7 = fVar5 + fVar5 + fVar7;
      }
      local_28.Max.y = ImGuiWindow::MenuBarHeight(this);
      local_28.Max.y = local_28.Max.y + fVar7 + fVar4;
      local_28.Max.x = 3.4028235e+38;
      local_28.Min.x = -3.4028235e+38;
      local_28.Min.y = fVar6 + fVar4;
    }
    else {
      fVar4 = (GImGui->Style).ItemInnerSpacing.x;
      fVar7 = (this->Pos).x;
      local_28.Min.x = fVar4 + fVar7;
      local_28.Max.x = ((fVar7 + (this->Size).x) - fVar4) - (this->ScrollbarSizes).x;
      local_28.Max.y = 3.4028235e+38;
      local_28.Min.y = -3.4028235e+38;
    }
  }
  IVar1 = FindBestWindowPosForPopupEx
                    (&window->Pos,&window->Size,&window->AutoPosLastDirection,&local_38,&local_28,
                     ImGuiPopupPositionPolicy_Default);
  fVar4 = IVar1.x;
  fVar5 = IVar1.y;
LAB_00145909:
  IVar1.y = fVar5;
  IVar1.x = fVar4;
  return IVar1;
}

Assistant:

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    ImRect r_outer = GetWindowAllowedExtentRect(window);
    if (window->Flags & ImGuiWindowFlags_ChildMenu)
    {
        // Child menus typically request _any_ position within the parent menu item, and then we move the new menu outside the parent bounds.
        // This is how we end up with child menus appearing (most-commonly) on the right of the parent menu.
        IM_ASSERT(g.CurrentWindow == window);
        ImGuiWindow* parent_window = g.CurrentWindowStack[g.CurrentWindowStack.Size - 2];
        float horizontal_overlap = g.Style.ItemInnerSpacing.x; // We want some overlap to convey the relative depth of each menu (currently the amount of overlap is hard-coded to style.ItemSpacing.x).
        ImRect r_avoid;
        if (parent_window->DC.MenuBarAppending)
            r_avoid = ImRect(-FLT_MAX, parent_window->Pos.y + parent_window->TitleBarHeight(), FLT_MAX, parent_window->Pos.y + parent_window->TitleBarHeight() + parent_window->MenuBarHeight());
        else
            r_avoid = ImRect(parent_window->Pos.x + horizontal_overlap, -FLT_MAX, parent_window->Pos.x + parent_window->Size.x - horizontal_overlap - parent_window->ScrollbarSizes.x, FLT_MAX);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid);
    }
    if (window->Flags & ImGuiWindowFlags_Popup)
    {
        ImRect r_avoid = ImRect(window->Pos.x - 1, window->Pos.y - 1, window->Pos.x + 1, window->Pos.y + 1);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid);
    }
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Position tooltip (always follows mouse)
        float sc = g.Style.MouseCursorScale;
        ImVec2 ref_pos = NavCalcPreferredRefPos();
        ImRect r_avoid;
        if (!g.NavDisableHighlight && g.NavDisableMouseHover && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableSetMousePos))
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 16, ref_pos.y + 8);
        else
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 24 * sc, ref_pos.y + 24 * sc); // FIXME: Hard-coded based on mouse cursor shape expectation. Exact dimension not very important.
        ImVec2 pos = FindBestWindowPosForPopupEx(ref_pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid);
        if (window->AutoPosLastDirection == ImGuiDir_None)
            pos = ref_pos + ImVec2(2, 2); // If there's not enough room, for tooltip we prefer avoiding the cursor at all cost even if it means that part of the tooltip won't be visible.
        return pos;
    }
    IM_ASSERT(0);
    return window->Pos;
}